

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O0

void __thiscall Imf_3_3::TimeCode::setTimeAndFlags(TimeCode *this,uint value,Packing packing)

{
  int in_EDX;
  uint in_ESI;
  uint *in_RDI;
  bool value_00;
  
  if (in_EDX == 1) {
    *in_RDI = in_ESI & 0x3f7f7fbf;
    value_00 = SUB81((ulong)in_RDI >> 0x38,0);
    if ((in_ESI & 0x8000) != 0) {
      setBgf0((TimeCode *)CONCAT44(in_ESI,1),value_00);
    }
    if ((in_ESI & 0x800000) != 0) {
      setBgf2((TimeCode *)CONCAT44(in_ESI,in_EDX),value_00);
    }
    if ((in_ESI & 0x40000000) != 0) {
      setBgf1((TimeCode *)CONCAT44(in_ESI,in_EDX),value_00);
    }
    if ((in_ESI & 0x80000000) != 0) {
      setFieldPhase((TimeCode *)CONCAT44(in_ESI,in_EDX),value_00);
    }
  }
  else if (in_EDX == 2) {
    *in_RDI = in_ESI & 0xffffff3f;
  }
  else {
    *in_RDI = in_ESI;
  }
  return;
}

Assistant:

void
TimeCode::setTimeAndFlags (unsigned int value, Packing packing)
{
    if (packing == TV50_PACKING)
    {
        _time =
            value & ~((1 << 6) | (1 << 15) | (1 << 23) | (1 << 30) | (1 << 31));

        if (value & (1 << 15)) setBgf0 (true);

        if (value & (1 << 23)) setBgf2 (true);

        if (value & (1 << 30)) setBgf1 (true);

        if (value & (1 << 31)) setFieldPhase (true);
    }
    else if (packing == FILM24_PACKING)
    {
        _time = value & ~((1 << 6) | (1 << 7));
    }
    else // packing == TV60_PACKING
    {
        _time = value;
    }
}